

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

int execle(char *__path,char *__arg,...)

{
  char **__envp;
  long lVar1;
  char in_AL;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *plVar8;
  long *plVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar10;
  long lVar11;
  char **__argv;
  long lVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 local_120;
  char *local_118 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  void *local_60;
  char *local_58;
  long local_50;
  ulong local_48;
  va_list argv_itr;
  
  local_50 = (long)local_118;
  local_58 = __path;
  argv_itr[0].overflow_arg_area = local_118;
  local_118[2] = (char *)in_RDX;
  local_118[3] = (char *)in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  plVar8 = (long *)&stack0x00000008;
  argv_itr[0]._0_8_ = plVar8;
  local_48 = 0x3000000010;
  uVar7 = 0x10;
  lVar12 = 1;
  do {
    if (uVar7 < 0x29) {
      uVar10 = (ulong)uVar7;
      uVar7 = uVar7 + 8;
      local_48 = CONCAT44(local_48._4_4_,uVar7);
      plVar9 = (long *)((long)argv_itr[0].overflow_arg_area + uVar10);
    }
    else {
      argv_itr[0]._0_8_ = plVar8 + 1;
      plVar9 = plVar8;
      plVar8 = plVar8 + 1;
    }
    lVar12 = lVar12 + 1;
  } while (*plVar9 != 0);
  uVar10 = lVar12 * 8 + 0xfU & 0xfffffffffffffff0;
  lVar1 = -uVar10;
  __argv = (char **)((long)local_118 + lVar1);
  argv_itr[0]._0_8_ = &stack0x00000008;
  local_48 = 0x3000000010;
  *(undefined8 *)((long)&local_120 + lVar1) = 0x103de0;
  pcVar3 = strdup(__arg);
  *(char **)((long)local_118 - uVar10) = pcVar3;
  local_60 = argv_itr[0].overflow_arg_area;
  uVar10 = 1;
  puVar6 = (undefined8 *)argv_itr[0]._0_8_;
  uVar7 = (uint)local_48;
  while( true ) {
    if (uVar7 < 0x29) {
      uVar4 = (ulong)uVar7;
      uVar7 = uVar7 + 8;
      local_48 = CONCAT44(local_48._4_4_,uVar7);
      puVar5 = (undefined8 *)(uVar4 + (long)local_60);
    }
    else {
      argv_itr[0]._0_8_ = puVar6 + 1;
      puVar5 = puVar6;
      puVar6 = (undefined8 *)argv_itr[0]._0_8_;
    }
    pcVar3 = (char *)*puVar5;
    if (pcVar3 == (char *)0x0) break;
    *(undefined8 *)((long)&local_120 + lVar1) = 0x103e24;
    pcVar3 = strdup(pcVar3);
    __argv[uVar10] = pcVar3;
    uVar10 = uVar10 + 1;
  }
  __argv[uVar10 & 0xffffffff] = (char *)0x0;
  pcVar3 = local_58;
  uVar10 = local_48 & 0xffffffff;
  if (uVar10 < 0x29) {
    local_48 = CONCAT44(local_48._4_4_,(uint)local_48 + 8);
    puVar6 = (undefined8 *)(uVar10 + (long)argv_itr[0].overflow_arg_area);
  }
  else {
    puVar6 = (undefined8 *)argv_itr[0]._0_8_;
    argv_itr[0]._0_8_ = argv_itr[0]._0_8_ + 8;
  }
  __envp = (char **)*puVar6;
  *(undefined8 *)((long)&local_120 + lVar1) = 0x103e6e;
  iVar2 = execve(pcVar3,__argv,__envp);
  if (lVar12 != 0) {
    lVar11 = 0;
    do {
      pcVar3 = __argv[lVar11];
      *(undefined8 *)((long)&local_120 + lVar1) = 0x103e81;
      free(pcVar3);
      lVar11 = lVar11 + 1;
    } while (lVar12 != lVar11);
  }
  return iVar2;
}

Assistant:

int execle(const char *path, const char *args, ...) {
    va_list argv_itr;

    size_t argc = 2; // reserve one for the path and one for NULL termination

    // count args received
    va_start(argv_itr, args);
    const char *arg_value = NULL;
    while ((arg_value = va_arg(argv_itr, const char *)) != NULL)
        argc++;
    va_end(argv_itr);

    // fill argv
    char *argv[argc];
    va_start(argv_itr, args);

    argv[0] = strdup(args);
    int offset = 1;
    while ((arg_value = va_arg(argv_itr, const char *)) != NULL) {
        argv[offset] = strdup(arg_value);
        offset++;
    }

    argv[offset] = NULL;
    char **envp = va_arg(argv_itr, char **);
    va_end(argv_itr);

    int res = execve(path, argv, envp);

    // free allocated strings
    for (int i = 0; i < argc; i++)
        free(argv[i]);

    return res;
}